

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueriesDefaultValues
          (TextureFilterMinmaxParameterQueriesTestCase *this,Functions *gl)

{
  RenderContext *context;
  SupportedTextureType *pSVar1;
  bool bVar2;
  GLenum GVar3;
  TypedObjectWrapper<(glu::ObjectType)7> *this_00;
  TestError *pTVar4;
  Texture2D *this_01;
  pointer ppSVar5;
  pointer pSVar6;
  GLint params;
  MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> texture;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  sampler;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  this_00 = (TypedObjectWrapper<(glu::ObjectType)7> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)7>::TypedObjectWrapper(this_00,context);
  sampler.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  .m_data.ptr = this_00;
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glu::Sampler error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x21d);
  (*gl->getSamplerParameteriv)
            (((sampler.
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
               .m_data.ptr)->super_ObjectWrapper).m_object,0x9366,&params);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"getSamplerParameteriv error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x222);
  if (params != 0x9367) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"getSamplerParameteriv value mismatch with expected default",
               "params == GL_WEIGHTED_AVERAGE_ARB",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
               ,0x223);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  ppSVar5 = (this->m_utils).m_supportedTextureTypes.
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppSVar5 ==
        (this->m_utils).m_supportedTextureTypes.
        super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_ARB_ES3_1_compatibility");
      pSVar6 = (this->m_utils).m_supportedTextureDataTypes.
               super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_00aa72b0;
    }
    pSVar1 = *ppSVar5;
    (*gl->getTexParameteriv)(pSVar1->m_type,0x9366,&params);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"getTexParameteriv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x22b);
    if (params != 0x9367) break;
    (*gl->getTexParameterIiv)(pSVar1->m_type,0x9366,&params);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"getTexParameterIiv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x22f);
    ppSVar5 = ppSVar5 + 1;
    if (params != 0x9367) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"getTexParameterIiv value mismatch with expected default",
                 "params == GL_WEIGHTED_AVERAGE_ARB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                 ,0x230);
LAB_00aa73f9:
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"getTexParameteriv value mismatch with expected default",
             "params == GL_WEIGHTED_AVERAGE_ARB",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
             ,0x22c);
  goto LAB_00aa73f9;
LAB_00aa72b0:
  if (pSVar6 == (this->m_utils).m_supportedTextureDataTypes.
                super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
    ::~UniqueBase(&sampler.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                 );
    return;
  }
  if ((byte)(~bVar2 & ((byte)pSVar6->m_testFlags & 2) >> 1) == 0) {
    this_01 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D(this_01,context,pSVar6->m_format,pSVar6->m_type,0x20,0x20);
    texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr =
         this_01;
    (*this_01->_vptr_Texture2D[2])(this_01);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"glu::Texture2D error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x23e);
    (*gl->getTextureParameteriv)
              ((texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data
               .ptr)->m_glTexture,0x9366,&params);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"getTextureParameteriv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x241);
    if (params != 0x9367) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"getTextureParameteriv value mismatch with expected default",
                 "params == GL_WEIGHTED_AVERAGE_ARB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                 ,0x242);
LAB_00aa746d:
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*gl->getTextureParameterIiv)
              ((texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data
               .ptr)->m_glTexture,0x9366,&params);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"getTextureParameterIiv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x245);
    if (params != 0x9367) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"getTextureParameterIiv value mismatch with expected default",
                 "params == GL_WEIGHTED_AVERAGE_ARB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                 ,0x246);
      goto LAB_00aa746d;
    }
    de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~UniqueBase
              (&texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  }
  pSVar6 = pSVar6 + 1;
  goto LAB_00aa72b0;
}

Assistant:

void TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueriesDefaultValues(const glw::Functions& gl)
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	de::MovePtr<glu::Sampler> sampler		= de::MovePtr<glu::Sampler>(new glu::Sampler(renderContext));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Sampler error occurred");

	glw::GLint params;

	gl.getSamplerParameteriv(**sampler, GL_TEXTURE_REDUCTION_MODE_ARB, &params);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getSamplerParameteriv error occurred");
	TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getSamplerParameteriv value mismatch with expected default");

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter iter = m_utils.getSupportedTextureTypes().begin();
		 iter != m_utils.getSupportedTextureTypes().end(); ++iter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *iter;

		gl.getTexParameteriv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTexParameteriv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTexParameteriv value mismatch with expected default");

		gl.getTexParameterIiv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTexParameterIiv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTexParameterIiv value mismatch with expected default");
	}

	bool is_arb_es31_compatibility = m_context.getContextInfo().isExtensionSupported("GL_ARB_ES3_1_compatibility");

	for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter iter = m_utils.getSupportedTextureDataTypes().begin();
		 iter != m_utils.getSupportedTextureDataTypes().end(); ++iter)
	{
		if (iter->hasFlag(TextureFilterMinmaxUtils::COMPATIBILITY) && !is_arb_es31_compatibility)
			continue;

		de::MovePtr<glu::Texture2D> texture = de::MovePtr<glu::Texture2D>(new glu::Texture2D(
			renderContext, iter->m_format, iter->m_type, TEXTURE_FILTER_MINMAX_SIZE, TEXTURE_FILTER_MINMAX_SIZE));
		texture->upload();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

		gl.getTextureParameteriv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTextureParameteriv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTextureParameteriv value mismatch with expected default");

		gl.getTextureParameterIiv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTextureParameterIiv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTextureParameterIiv value mismatch with expected default");
	}
}